

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastPrintMatrix(Gia_Man_t *p,Vec_Wec_t *vProds,int fVerbose)

{
  FILE *pFile;
  Vec_Wrd_t *p_00;
  Vec_Wec_t *p_01;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pObj;
  int local_48;
  int iLit;
  int k;
  int i;
  word Truth;
  Vec_Int_t *vLevel;
  Vec_Wrd_t *vTemp;
  Vec_Int_t *vSupp;
  Vec_Wec_t *pVStack_18;
  int fVerbose_local;
  Vec_Wec_t *vProds_local;
  Gia_Man_t *p_local;
  
  vSupp._4_4_ = fVerbose;
  pVStack_18 = vProds;
  vProds_local = (Vec_Wec_t *)p;
  vTemp = (Vec_Wrd_t *)Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum((Gia_Man_t *)vProds_local);
  vLevel = (Vec_Int_t *)Vec_WrdStart(iVar1);
  for (iLit = 0; iVar1 = Vec_WecSize(pVStack_18), iLit < iVar1; iLit = iLit + 1) {
    Truth = (word)Vec_WecEntry(pVStack_18,iLit);
    for (local_48 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)Truth), local_48 < iVar1;
        local_48 = local_48 + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)Truth,local_48);
      p_01 = vProds_local;
      iVar2 = Abc_Lit2Var(iVar1);
      pObj = Gia_ManObj((Gia_Man_t *)p_01,iVar2);
      iVar2 = Gia_ObjIsAnd(pObj);
      p_00 = vTemp;
      if (iVar2 != 0) {
        iVar1 = Abc_Lit2Var(iVar1);
        Vec_IntPushUnique((Vec_Int_t *)p_00,iVar1);
      }
    }
  }
  uVar3 = Vec_WecSizeSize(pVStack_18);
  uVar4 = Vec_IntSize((Vec_Int_t *)vTemp);
  uVar5 = Gia_ManAndNum((Gia_Man_t *)vProds_local);
  printf("Booth partial products: %d pps, %d unique, %d nodes.\n",(ulong)uVar3,(ulong)uVar4,
         (ulong)uVar5);
  Vec_IntPrint((Vec_Int_t *)vTemp);
  if (vSupp._4_4_ != 0) {
    for (iLit = 0; iVar1 = Vec_WecSize(pVStack_18), iLit < iVar1; iLit = iLit + 1) {
      Truth = (word)Vec_WecEntry(pVStack_18,iLit);
      for (local_48 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)Truth), local_48 < iVar1;
          local_48 = local_48 + 1) {
        iVar1 = Vec_IntEntry((Vec_Int_t *)Truth,local_48);
        uVar3 = Abc_Lit2Var(iVar1);
        printf("Obj = %4d : ",(ulong)uVar3);
        uVar3 = Abc_LitIsCompl(iVar1);
        printf("Compl = %d  ",(ulong)uVar3);
        printf("Rank = %2d  ",(ulong)(uint)iLit);
        _k = Gia_ObjComputeTruth6Cis
                       ((Gia_Man_t *)vProds_local,iVar1,(Vec_Int_t *)vTemp,(Vec_Wrd_t *)vLevel);
        pFile = _stdout;
        iVar1 = Vec_IntSize((Vec_Int_t *)vTemp);
        Extra_PrintHex(pFile,(uint *)&k,iVar1);
        iVar1 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar1 == 4) {
          printf("    ");
        }
        iVar1 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar1 == 3) {
          printf("      ");
        }
        iVar1 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar1 < 3) {
          printf("       ");
        }
        printf("  ");
        Vec_IntPrint((Vec_Int_t *)vTemp);
        iVar1 = Vec_IntSize((Vec_Int_t *)Truth);
        if (local_48 == iVar1 + -1) {
          printf("\n");
        }
      }
    }
  }
  Vec_IntFree((Vec_Int_t *)vTemp);
  Vec_WrdFree((Vec_Wrd_t *)vLevel);
  return;
}

Assistant:

void Wlc_BlastPrintMatrix( Gia_Man_t * p, Vec_Wec_t * vProds, int fVerbose )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;  word Truth;
    int i, k, iLit; 
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
                Vec_IntPushUnique( vSupp, Abc_Lit2Var(iLit) );
    printf( "Booth partial products: %d pps, %d unique, %d nodes.\n", 
        Vec_WecSizeSize(vProds), Vec_IntSize(vSupp), Gia_ManAndNum(p) );
    Vec_IntPrint( vSupp );

    if ( fVerbose )
    Vec_WecForEachLevel( vProds, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            printf( "Obj = %4d : ", Abc_Lit2Var(iLit) );
            printf( "Compl = %d  ", Abc_LitIsCompl(iLit) );
            printf( "Rank = %2d  ", i );
            Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
            if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
            if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
            if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
            printf( "  " );
            Vec_IntPrint( vSupp );
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
}